

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bread.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  char **in_RSI;
  int in_EDI;
  exception *ex;
  istream *input;
  ifstream inputFile;
  string *in_stack_000000c8;
  string *in_stack_000000d0;
  ostream *in_stack_000000d8;
  istream *in_stack_000000e0;
  int opt;
  bool sorted;
  string dateFormat;
  string format;
  string inputPath;
  ifstream *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  undefined1 local_2a8 [336];
  string *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  ostream *in_stack_fffffffffffffeb8;
  istream *in_stack_fffffffffffffec0;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"-",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"%S %C [%d] %n %m (%G:%L)\n",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"%Y-%m-%d %H:%M:%S.%N",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  bVar1 = false;
  while (iVar3 = getopt(local_8,local_10,"f:d:sh"), iVar3 != -1) {
    switch(iVar3) {
    case 100:
      std::__cxx11::string::operator=(local_90,_optarg);
      break;
    default:
      anon_unknown.dwarf_a1f::showHelp();
      local_4 = 1;
      goto LAB_00103b3b;
    case 0x66:
      std::__cxx11::string::operator=(local_68,_optarg);
      std::__cxx11::string::operator+=(local_68,"\n");
      break;
    case 0x68:
      anon_unknown.dwarf_a1f::showHelp();
      local_4 = 0;
      goto LAB_00103b3b;
    case 0x73:
      bVar1 = true;
    }
  }
  if (_optind < local_8) {
    std::__cxx11::string::operator=(local_30,local_10[_optind]);
  }
  std::ifstream::ifstream(local_2a8);
  piVar4 = anon_unknown.dwarf_a1f::openFile(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  bVar2 = std::ios::operator!((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::ios_base::sync_with_stdio(false);
    if (bVar1) {
      printSortedEvents(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
    }
    else {
      printEvents(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                  in_stack_fffffffffffffea8);
    }
    local_4 = 0;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"[bread] Failed to open \'");
    poVar5 = std::operator<<(poVar5,local_30);
    std::operator<<(poVar5,"\' for reading\n");
    local_4 = 2;
  }
  std::ifstream::~ifstream(local_2a8);
LAB_00103b3b:
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, /*const*/ char* argv[])
{
  std::string inputPath = "-";
  std::string format = BINLOG_DEFAULT_FORMAT "\n";
  std::string dateFormat = BINLOG_DEFAULT_DATE_FORMAT;
  bool sorted = false;

  int opt;
  while ((opt = getopt(argc, argv, "f:d:sh")) != -1) // NOLINT(concurrency-mt-unsafe)
  {
    switch (opt)
    {
    case 'f':
      format = optarg;
      format += "\n";
      break;
    case 'd':
      dateFormat = optarg;
      break;
    case 's':
      sorted = true;
      break;
    case 'h':
      showHelp();
      return 0;
    default:
      // getopt prints a useful error message by default (opterr is set)
      showHelp();
      return 1;
    }
  }

  if (optind < argc)
  {
    inputPath = argv[optind];
  }

  std::ifstream inputFile;
  std::istream& input = openFile(inputPath, inputFile);
  if (! input)
  {
    std::cerr << "[bread] Failed to open '" << inputPath << "' for reading\n";
    return 2;
  }

  std::ostream::sync_with_stdio(false);

  try
  {
    if (sorted)
    {
      printSortedEvents(input, std::cout, format, dateFormat);
    }
    else
    {
      printEvents(input, std::cout, format, dateFormat);
    }
  }
  catch (const std::exception& ex)
  {
    std::cerr << "[bread] Exception: " << ex.what() << "\n";
    return 3;
  }

  return 0;
}